

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::Q3BSPFileImporter::importLightmap
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiMaterial *pMatHelper,
          int lightmapId)

{
  pointer *pppaVar1;
  pointer ppsVar2;
  sQ3BSPLightmap *__src;
  iterator __position;
  ulong uVar3;
  byte bVar4;
  aiTexture *paVar5;
  aiTexel *__dest;
  ulong uVar6;
  int iVar7;
  uchar *puVar8;
  long lVar9;
  char *__s;
  bool bVar10;
  bool bVar11;
  aiTexture *pTexture;
  aiTexture *local_438;
  aiString local_42c;
  
  if (((lightmapId < 0 || pMatHelper == (aiMaterial *)0x0) ||
       (pScene == (aiScene *)0x0 || pModel == (Q3BSPModel *)0x0)) ||
     (ppsVar2 = (pModel->m_Lightmaps).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(pModel->m_Lightmaps).
                         super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2) >> 3) <=
     lightmapId)) {
    lVar9 = 0;
  }
  else {
    __src = ppsVar2[(uint)lightmapId];
    lVar9 = 0;
    if (__src != (sQ3BSPLightmap *)0x0) {
      paVar5 = (aiTexture *)operator_new(0x428);
      paVar5->pcData = (aiTexel *)0x0;
      (paVar5->mFilename).length = 0;
      (paVar5->mFilename).data[0] = '\0';
      memset((paVar5->mFilename).data + 1,0x1b,0x3ff);
      paVar5->achFormatHint[0] = '\0';
      paVar5->achFormatHint[1] = '\0';
      paVar5->achFormatHint[2] = '\0';
      paVar5->achFormatHint[3] = '\0';
      paVar5->mWidth = 0x80;
      paVar5->mHeight = 0x80;
      local_438 = paVar5;
      __dest = (aiTexel *)operator_new__(0x10000);
      paVar5->pcData = __dest;
      memcpy(__dest,__src,0x80);
      puVar8 = __src->bLMapData + 2;
      do {
        paVar5->pcData[lVar9].r = ((sQ3BSPLightmap *)(puVar8 + -2))->bLMapData[0];
        paVar5->pcData[lVar9].g = puVar8[-1];
        paVar5->pcData[lVar9].b = *puVar8;
        paVar5->pcData[lVar9].a = 0xff;
        lVar9 = lVar9 + 1;
        puVar8 = puVar8 + 3;
      } while (lVar9 != 0x4000);
      __s = local_42c.data + 1;
      memset(__s,0x1b,0x3ff);
      local_42c.data[0] = '*';
      uVar6 = (ulong)((long)(this->mTextures).
                            super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->mTextures).
                           super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      local_42c.length = 1;
      if ((int)uVar6 < 0) {
        __s = local_42c.data + 2;
        local_42c.data[1] = '-';
        uVar6 = (ulong)(uint)-(int)uVar6;
        local_42c.length = 2;
      }
      iVar7 = 1000000000;
      bVar4 = 0;
      do {
        uVar3 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        lVar9 = (long)uVar3 / (long)iVar7;
        bVar10 = (int)lVar9 != 0;
        bVar11 = iVar7 == 1;
        if ((bool)(bVar4 | bVar11 | bVar10)) {
          *__s = (char)lVar9 + '0';
          __s = __s + 1;
          local_42c.length = local_42c.length + 1;
          uVar6 = (long)uVar3 % (long)iVar7 & 0xffffffff;
          if (iVar7 == 1) break;
        }
        iVar7 = iVar7 / 10;
        bVar4 = bVar4 | bVar11 | bVar10;
      } while (local_42c.length < 0x3ff);
      *__s = '\0';
      aiMaterial::AddProperty(pMatHelper,&local_42c,"$tex.file",10,1);
      __position._M_current =
           (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiTexture*,std::allocator<aiTexture*>>::_M_realloc_insert<aiTexture*const&>
                  ((vector<aiTexture*,std::allocator<aiTexture*>> *)&this->mTextures,__position,
                   &local_438);
      }
      else {
        *__position._M_current = local_438;
        pppaVar1 = &(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      lVar9 = 1;
    }
  }
  return SUB81(lVar9,0);
}

Assistant:

bool Q3BSPFileImporter::importLightmap( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
                                       aiMaterial *pMatHelper, int lightmapId )
{
    if (nullptr == pModel || nullptr == pScene || nullptr == pMatHelper ) {
        return false;
    }

    if ( lightmapId < 0 || lightmapId >= static_cast<int>( pModel->m_Lightmaps.size() ) ) {
        return false;
    }

    sQ3BSPLightmap *pLightMap = pModel->m_Lightmaps[ lightmapId ];
    if (nullptr == pLightMap ) {
        return false;
    }

    aiTexture *pTexture = new aiTexture;

    pTexture->mWidth = CE_BSP_LIGHTMAPWIDTH;
    pTexture->mHeight = CE_BSP_LIGHTMAPHEIGHT;
    pTexture->pcData = new aiTexel[CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT];

    ::memcpy( pTexture->pcData, pLightMap->bLMapData, pTexture->mWidth );
    size_t p = 0;
    for ( size_t i = 0; i < CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT; ++i ) {
        pTexture->pcData[ i ].r = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].g = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].b = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].a = 0xFF;
    }

    aiString name;
    name.data[ 0 ] = '*';
    name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

    pMatHelper->AddProperty( &name,AI_MATKEY_TEXTURE_LIGHTMAP( 1 ) );
    mTextures.push_back( pTexture );

    return true;
}